

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_PNGFilter.cc
# Opt level: O2

void __thiscall Pl_PNGFilter::decodeUp(Pl_PNGFilter *this)

{
  uchar *puVar1;
  uchar *puVar2;
  uint i;
  ulong uVar3;
  
  puVar1 = this->cur_row;
  puVar2 = this->prev_row;
  for (uVar3 = 0; uVar3 < this->bytes_per_row; uVar3 = uVar3 + 1) {
    puVar1[uVar3 + 1] = puVar1[uVar3 + 1] + puVar2[uVar3 + 1];
  }
  return;
}

Assistant:

void
Pl_PNGFilter::decodeUp()
{
    QTC::TC("libtests", "Pl_PNGFilter decodeUp");
    unsigned char* buffer = this->cur_row + 1;
    unsigned char* above_buffer = this->prev_row + 1;

    for (unsigned int i = 0; i < this->bytes_per_row; ++i) {
        unsigned char up = above_buffer[i];
        buffer[i] = static_cast<unsigned char>(buffer[i] + up);
    }
}